

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::load(Compiler *this,SchemaLoader *loader,uint64_t id)

{
  kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
  Impl::loadFinal((this->impl).value.ptr,loader,id);
  kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE);
  return;
}

Assistant:

void Compiler::load(const SchemaLoader& loader, uint64_t id) const {
  impl.lockExclusive()->get()->loadFinal(loader, id);
}